

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mems.cpp
# Opt level: O1

void __thiscall Mems::find_samples_next_to_mirror_fast(Mems *this,Portioner *buckets)

{
  pointer *ppPVar1;
  Point_d *pPVar2;
  Point_d *pPVar3;
  int iVar4;
  pointer pPVar5;
  iterator __position;
  pointer pMVar6;
  pointer pMVar7;
  __normal_iterator<Point_d_*,_std::vector<Point_d,_std::allocator<Point_d>_>_> __first;
  __normal_iterator<Point_d_*,_std::vector<Point_d,_std::allocator<Point_d>_>_> __last;
  double dVar8;
  double dVar9;
  undefined8 uVar10;
  Point_d *pPVar11;
  undefined4 uVar12;
  ostream *poVar13;
  ulong uVar14;
  __normal_iterator<Point_d_*,_std::vector<Point_d,_std::allocator<Point_d>_>_> _Var15;
  pointer pMVar16;
  Point_d *pPVar17;
  undefined1 auVar18 [8];
  size_t __n;
  uint uVar19;
  __normal_iterator<Point_d_*,_std::vector<Point_d,_std::allocator<Point_d>_>_> __i;
  long lVar20;
  bool bVar21;
  double dVar22;
  undefined1 auVar23 [16];
  undefined1 auStack_58 [8];
  vector<std::vector<Point_d,_std::allocator<Point_d>_>,_std::allocator<std::vector<Point_d,_std::allocator<Point_d>_>_>_>
  point_cluster;
  
  pMVar16 = (this->_mems_mirrors).super__Vector_base<Mirror,_std::allocator<Mirror>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (pMVar16 !=
      (this->_mems_mirrors).super__Vector_base<Mirror,_std::allocator<Mirror>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      Portioner::get_bucket_cluster
                ((vector<std::vector<Point_d,_std::allocator<Point_d>_>,_std::allocator<std::vector<Point_d,_std::allocator<Point_d>_>_>_>
                  *)auStack_58,buckets,&pMVar16->_position);
      uVar19 = 5;
      do {
        pPVar5 = (pMVar16->_matching_samples).super__Vector_base<Point_d,_std::allocator<Point_d>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        if ((pMVar16->_matching_samples).super__Vector_base<Point_d,_std::allocator<Point_d>_>.
            _M_impl.super__Vector_impl_data._M_finish != pPVar5) {
          (pMVar16->_matching_samples).super__Vector_base<Point_d,_std::allocator<Point_d>_>._M_impl
          .super__Vector_impl_data._M_finish = pPVar5;
        }
        pMVar16->_ammount_of_matching_samples = 0;
        if (auStack_58 !=
            (undefined1  [8])
            CONCAT44(point_cluster.
                     super__Vector_base<std::vector<Point_d,_std::allocator<Point_d>_>,_std::allocator<std::vector<Point_d,_std::allocator<Point_d>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start._4_4_,
                     point_cluster.
                     super__Vector_base<std::vector<Point_d,_std::allocator<Point_d>_>,_std::allocator<std::vector<Point_d,_std::allocator<Point_d>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start._0_4_)) {
          auVar18 = auStack_58;
          do {
            for (pPVar17 = (((pointer)auVar18)->
                           super__Vector_base<Point_d,_std::allocator<Point_d>_>)._M_impl.
                           super__Vector_impl_data._M_start;
                pPVar17 !=
                (((pointer)auVar18)->super__Vector_base<Point_d,_std::allocator<Point_d>_>)._M_impl.
                super__Vector_impl_data._M_finish; pPVar17 = pPVar17 + 1) {
              dVar22 = (pMVar16->_position).x - pPVar17->x;
              dVar8 = (pMVar16->_position).y - pPVar17->y;
              dVar8 = dVar8 * dVar8 + dVar22 * dVar22;
              if (dVar8 <= (double)(int)(uVar19 * uVar19 * 2)) {
                pPVar17->dis = dVar8;
                __position._M_current =
                     (pMVar16->_matching_samples).
                     super__Vector_base<Point_d,_std::allocator<Point_d>_>._M_impl.
                     super__Vector_impl_data._M_finish;
                if (__position._M_current ==
                    (pMVar16->_matching_samples).
                    super__Vector_base<Point_d,_std::allocator<Point_d>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  std::vector<Point_d,std::allocator<Point_d>>::_M_realloc_insert<Point_d_const&>
                            ((vector<Point_d,std::allocator<Point_d>> *)&pMVar16->_matching_samples,
                             __position,pPVar17);
                }
                else {
                  dVar8 = pPVar17->x;
                  dVar22 = pPVar17->y;
                  iVar4 = pPVar17->id;
                  uVar12 = *(undefined4 *)&pPVar17->field_0x1c;
                  (__position._M_current)->dis = pPVar17->dis;
                  (__position._M_current)->id = iVar4;
                  *(undefined4 *)&(__position._M_current)->field_0x1c = uVar12;
                  (__position._M_current)->x = dVar8;
                  (__position._M_current)->y = dVar22;
                  ppPVar1 = &(pMVar16->_matching_samples).
                             super__Vector_base<Point_d,_std::allocator<Point_d>_>._M_impl.
                             super__Vector_impl_data._M_finish;
                  *ppPVar1 = *ppPVar1 + 1;
                }
                pMVar16->_ammount_of_matching_samples = pMVar16->_ammount_of_matching_samples + 1;
              }
            }
            auVar18 = (undefined1  [8])((long)auVar18 + 0x18);
          } while (auVar18 !=
                   (undefined1  [8])
                   CONCAT44(point_cluster.
                            super__Vector_base<std::vector<Point_d,_std::allocator<Point_d>_>,_std::allocator<std::vector<Point_d,_std::allocator<Point_d>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start._4_4_,
                            point_cluster.
                            super__Vector_base<std::vector<Point_d,_std::allocator<Point_d>_>,_std::allocator<std::vector<Point_d,_std::allocator<Point_d>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start._0_4_));
        }
      } while (((ulong)((long)(pMVar16->_matching_samples).
                              super__Vector_base<Point_d,_std::allocator<Point_d>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                       (long)(pMVar16->_matching_samples).
                             super__Vector_base<Point_d,_std::allocator<Point_d>_>._M_impl.
                             super__Vector_impl_data._M_start) < 0x81) &&
              (bVar21 = uVar19 < 0x12, uVar19 = uVar19 + 2, bVar21));
      iVar4 = pMVar16->id;
      if ((iVar4 * 0x3afb7e91 + 0x346dc0U >> 4 | iVar4 * 0x10000000) < 0x68db9) {
        pMVar6 = (this->_mems_mirrors).super__Vector_base<Mirror,_std::allocator<Mirror>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pMVar7 = (this->_mems_mirrors).super__Vector_base<Mirror,_std::allocator<Mirror>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Find samples for all Mems-Mirrors  ",0x23);
        lVar20 = ((long)pMVar7 - (long)pMVar6 >> 3) * -0xf0f0f0f0f0f0f0f;
        auVar23._8_4_ = (int)((ulong)lVar20 >> 0x20);
        auVar23._0_8_ = lVar20;
        auVar23._12_4_ = 0x45300000;
        poVar13 = (ostream *)
                  std::ostream::operator<<
                            ((ostream *)&std::cout,
                             (int)(((double)iVar4 /
                                   ((auVar23._8_8_ - 1.9342813113834067e+25) +
                                   ((double)CONCAT44(0x43300000,(int)lVar20) - 4503599627370496.0)))
                                  * 100.0));
        std::__ostream_insert<char,std::char_traits<char>>(poVar13," % . \n",6);
      }
      std::
      vector<std::vector<Point_d,_std::allocator<Point_d>_>,_std::allocator<std::vector<Point_d,_std::allocator<Point_d>_>_>_>
      ::~vector((vector<std::vector<Point_d,_std::allocator<Point_d>_>,_std::allocator<std::vector<Point_d,_std::allocator<Point_d>_>_>_>
                 *)auStack_58);
      pMVar16 = pMVar16 + 1;
    } while (pMVar16 !=
             (this->_mems_mirrors).super__Vector_base<Mirror,_std::allocator<Mirror>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"All samples for Mirrors found",0x1d);
  auStack_58[0] = 10;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,auStack_58,1);
  pMVar16 = (this->_mems_mirrors).super__Vector_base<Mirror,_std::allocator<Mirror>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (pMVar16 !=
      (this->_mems_mirrors).super__Vector_base<Mirror,_std::allocator<Mirror>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      __first._M_current =
           (pMVar16->_matching_samples).super__Vector_base<Point_d,_std::allocator<Point_d>_>.
           _M_impl.super__Vector_impl_data._M_start;
      __last._M_current =
           (pMVar16->_matching_samples).super__Vector_base<Point_d,_std::allocator<Point_d>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (__first._M_current != __last._M_current) {
        uVar14 = (long)__last._M_current - (long)__first._M_current >> 5;
        lVar20 = 0x3f;
        if (uVar14 != 0) {
          for (; uVar14 >> lVar20 == 0; lVar20 = lVar20 + -1) {
          }
        }
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<Point_d*,std::vector<Point_d,std::allocator<Point_d>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(Point_d_const&,Point_d_const&)>>
                  (__first,__last,(ulong)(((uint)lVar20 ^ 0x3f) * 2) ^ 0x7e,
                   (_Iter_comp_iter<bool_(*)(const_Point_d_&,_const_Point_d_&)>)0x10b3e9);
        _Var15._M_current = __first._M_current;
        if ((long)__last._M_current - (long)__first._M_current < 0x201) {
          while (pPVar17 = _Var15._M_current + 1, pPVar17 != __last._M_current) {
            dVar8 = pPVar17->dis;
            if ((__first._M_current)->dis <= dVar8) {
              auStack_58 = (undefined1  [8])pPVar17->x;
              dVar9 = pPVar17->y;
              point_cluster.
              super__Vector_base<std::vector<Point_d,_std::allocator<Point_d>_>,_std::allocator<std::vector<Point_d,_std::allocator<Point_d>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start._0_4_ = SUB84(dVar9,0);
              point_cluster.
              super__Vector_base<std::vector<Point_d,_std::allocator<Point_d>_>,_std::allocator<std::vector<Point_d,_std::allocator<Point_d>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start._4_4_ = (undefined4)((ulong)dVar9 >> 0x20);
              iVar4 = pPVar17->id;
              dVar22 = (_Var15._M_current)->dis;
              pPVar3 = pPVar17;
              while (dVar8 < dVar22) {
                uVar10 = *(undefined8 *)((long)&pPVar3[-1].dis + 4);
                *(undefined8 *)((long)&pPVar3->y + 4) = *(undefined8 *)((long)&pPVar3[-1].y + 4);
                *(undefined8 *)((long)&pPVar3->dis + 4) = uVar10;
                dVar22 = pPVar3[-1].y;
                pPVar3->x = pPVar3[-1].x;
                pPVar3->y = dVar22;
                dVar22 = pPVar3[-2].dis;
                pPVar3 = pPVar3 + -1;
              }
              pPVar3->x = (double)auStack_58;
              pPVar3->y = dVar9;
              pPVar3->dis = dVar8;
              pPVar3->id = iVar4;
              _Var15._M_current = pPVar17;
            }
            else {
              auStack_58 = (undefined1  [8])pPVar17->x;
              point_cluster.
              super__Vector_base<std::vector<Point_d,_std::allocator<Point_d>_>,_std::allocator<std::vector<Point_d,_std::allocator<Point_d>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish._0_4_ = SUB84(pPVar17->dis,0);
              point_cluster.
              super__Vector_base<std::vector<Point_d,_std::allocator<Point_d>_>,_std::allocator<std::vector<Point_d,_std::allocator<Point_d>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish._4_4_ =
                   (undefined4)((ulong)pPVar17->dis >> 0x20);
              point_cluster.
              super__Vector_base<std::vector<Point_d,_std::allocator<Point_d>_>,_std::allocator<std::vector<Point_d,_std::allocator<Point_d>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
                   (undefined4)*(undefined8 *)&pPVar17->id;
              point_cluster.
              super__Vector_base<std::vector<Point_d,_std::allocator<Point_d>_>,_std::allocator<std::vector<Point_d,_std::allocator<Point_d>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
                   (undefined4)((ulong)*(undefined8 *)&pPVar17->id >> 0x20);
              point_cluster.
              super__Vector_base<std::vector<Point_d,_std::allocator<Point_d>_>,_std::allocator<std::vector<Point_d,_std::allocator<Point_d>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start._0_4_ = SUB84(pPVar17->y,0);
              point_cluster.
              super__Vector_base<std::vector<Point_d,_std::allocator<Point_d>_>,_std::allocator<std::vector<Point_d,_std::allocator<Point_d>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start._4_4_ =
                   (undefined4)((ulong)pPVar17->y >> 0x20);
              memmove((void *)((long)_Var15._M_current +
                              (0x40 - ((long)pPVar17 - (long)__first._M_current))),
                      __first._M_current,(long)pPVar17 - (long)__first._M_current);
              (__first._M_current)->x = (double)auStack_58;
              (__first._M_current)->y =
                   (double)CONCAT44(point_cluster.
                                    super__Vector_base<std::vector<Point_d,_std::allocator<Point_d>_>,_std::allocator<std::vector<Point_d,_std::allocator<Point_d>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                    point_cluster.
                                    super__Vector_base<std::vector<Point_d,_std::allocator<Point_d>_>,_std::allocator<std::vector<Point_d,_std::allocator<Point_d>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start._0_4_);
              *(ulong *)((long)&(__first._M_current)->y + 4) =
                   CONCAT44(point_cluster.
                            super__Vector_base<std::vector<Point_d,_std::allocator<Point_d>_>,_std::allocator<std::vector<Point_d,_std::allocator<Point_d>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish._0_4_,
                            point_cluster.
                            super__Vector_base<std::vector<Point_d,_std::allocator<Point_d>_>,_std::allocator<std::vector<Point_d,_std::allocator<Point_d>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start._4_4_);
              *(ulong *)((long)&(__first._M_current)->dis + 4) =
                   CONCAT44(point_cluster.
                            super__Vector_base<std::vector<Point_d,_std::allocator<Point_d>_>,_std::allocator<std::vector<Point_d,_std::allocator<Point_d>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_,
                            point_cluster.
                            super__Vector_base<std::vector<Point_d,_std::allocator<Point_d>_>,_std::allocator<std::vector<Point_d,_std::allocator<Point_d>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish._4_4_);
              _Var15._M_current = pPVar17;
            }
          }
        }
        else {
          __n = 0x20;
          pPVar17 = __first._M_current + 1;
          do {
            pPVar3 = (Point_d *)((long)&(__first._M_current)->x + __n);
            dVar8 = *(double *)((long)&(__first._M_current)->dis + __n);
            if ((__first._M_current)->dis <= dVar8) {
              auStack_58 = (undefined1  [8])pPVar3->x;
              dVar9 = pPVar3->y;
              point_cluster.
              super__Vector_base<std::vector<Point_d,_std::allocator<Point_d>_>,_std::allocator<std::vector<Point_d,_std::allocator<Point_d>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start._0_4_ = SUB84(dVar9,0);
              point_cluster.
              super__Vector_base<std::vector<Point_d,_std::allocator<Point_d>_>,_std::allocator<std::vector<Point_d,_std::allocator<Point_d>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start._4_4_ = (undefined4)((ulong)dVar9 >> 0x20);
              iVar4 = pPVar3->id;
              dVar22 = (_Var15._M_current)->dis;
              pPVar2 = pPVar3;
              pPVar11 = pPVar17;
              while (dVar8 < dVar22) {
                pPVar2 = pPVar11 + -1;
                uVar10 = *(undefined8 *)((long)&pPVar11[-1].dis + 4);
                *(undefined8 *)((long)&pPVar11->y + 4) = *(undefined8 *)((long)&pPVar11[-1].y + 4);
                *(undefined8 *)((long)&pPVar11->dis + 4) = uVar10;
                dVar22 = pPVar11[-1].y;
                pPVar11->x = pPVar11[-1].x;
                pPVar11->y = dVar22;
                dVar22 = pPVar11[-2].dis;
                pPVar11 = pPVar2;
              }
              pPVar2->x = (double)auStack_58;
              pPVar2->y = dVar9;
              pPVar2->dis = dVar8;
              pPVar2->id = iVar4;
            }
            else {
              auStack_58 = (undefined1  [8])pPVar3->x;
              point_cluster.
              super__Vector_base<std::vector<Point_d,_std::allocator<Point_d>_>,_std::allocator<std::vector<Point_d,_std::allocator<Point_d>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish._0_4_ = SUB84(pPVar3->dis,0);
              point_cluster.
              super__Vector_base<std::vector<Point_d,_std::allocator<Point_d>_>,_std::allocator<std::vector<Point_d,_std::allocator<Point_d>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish._4_4_ =
                   (undefined4)((ulong)pPVar3->dis >> 0x20);
              point_cluster.
              super__Vector_base<std::vector<Point_d,_std::allocator<Point_d>_>,_std::allocator<std::vector<Point_d,_std::allocator<Point_d>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
                   (undefined4)*(undefined8 *)&pPVar3->id;
              point_cluster.
              super__Vector_base<std::vector<Point_d,_std::allocator<Point_d>_>,_std::allocator<std::vector<Point_d,_std::allocator<Point_d>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
                   (undefined4)((ulong)*(undefined8 *)&pPVar3->id >> 0x20);
              point_cluster.
              super__Vector_base<std::vector<Point_d,_std::allocator<Point_d>_>,_std::allocator<std::vector<Point_d,_std::allocator<Point_d>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start._0_4_ = SUB84(pPVar3->y,0);
              point_cluster.
              super__Vector_base<std::vector<Point_d,_std::allocator<Point_d>_>,_std::allocator<std::vector<Point_d,_std::allocator<Point_d>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start._4_4_ =
                   (undefined4)((ulong)pPVar3->y >> 0x20);
              memmove(__first._M_current + 1,__first._M_current,__n);
              (__first._M_current)->x = (double)auStack_58;
              (__first._M_current)->y =
                   (double)CONCAT44(point_cluster.
                                    super__Vector_base<std::vector<Point_d,_std::allocator<Point_d>_>,_std::allocator<std::vector<Point_d,_std::allocator<Point_d>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                    point_cluster.
                                    super__Vector_base<std::vector<Point_d,_std::allocator<Point_d>_>,_std::allocator<std::vector<Point_d,_std::allocator<Point_d>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start._0_4_);
              *(ulong *)((long)&(__first._M_current)->y + 4) =
                   CONCAT44(point_cluster.
                            super__Vector_base<std::vector<Point_d,_std::allocator<Point_d>_>,_std::allocator<std::vector<Point_d,_std::allocator<Point_d>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish._0_4_,
                            point_cluster.
                            super__Vector_base<std::vector<Point_d,_std::allocator<Point_d>_>,_std::allocator<std::vector<Point_d,_std::allocator<Point_d>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start._4_4_);
              *(ulong *)((long)&(__first._M_current)->dis + 4) =
                   CONCAT44(point_cluster.
                            super__Vector_base<std::vector<Point_d,_std::allocator<Point_d>_>,_std::allocator<std::vector<Point_d,_std::allocator<Point_d>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_,
                            point_cluster.
                            super__Vector_base<std::vector<Point_d,_std::allocator<Point_d>_>,_std::allocator<std::vector<Point_d,_std::allocator<Point_d>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish._4_4_);
            }
            __n = __n + 0x20;
            pPVar17 = pPVar17 + 1;
            _Var15._M_current = pPVar3;
          } while (__n != 0x200);
          for (pPVar17 = __first._M_current + 0x10; pPVar17 != __last._M_current;
              pPVar17 = pPVar17 + 1) {
            auStack_58 = (undefined1  [8])pPVar17->x;
            dVar9 = pPVar17->y;
            point_cluster.
            super__Vector_base<std::vector<Point_d,_std::allocator<Point_d>_>,_std::allocator<std::vector<Point_d,_std::allocator<Point_d>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start._0_4_ = SUB84(dVar9,0);
            point_cluster.
            super__Vector_base<std::vector<Point_d,_std::allocator<Point_d>_>,_std::allocator<std::vector<Point_d,_std::allocator<Point_d>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start._4_4_ = (undefined4)((ulong)dVar9 >> 0x20);
            dVar8 = pPVar17->dis;
            iVar4 = pPVar17->id;
            dVar22 = pPVar17[-1].dis;
            pPVar3 = pPVar17;
            while (dVar8 < dVar22) {
              uVar10 = *(undefined8 *)((long)&pPVar3[-1].dis + 4);
              *(undefined8 *)((long)&pPVar3->y + 4) = *(undefined8 *)((long)&pPVar3[-1].y + 4);
              *(undefined8 *)((long)&pPVar3->dis + 4) = uVar10;
              dVar22 = pPVar3[-1].y;
              pPVar3->x = pPVar3[-1].x;
              pPVar3->y = dVar22;
              dVar22 = pPVar3[-2].dis;
              pPVar3 = pPVar3 + -1;
            }
            pPVar3->x = (double)auStack_58;
            pPVar3->y = dVar9;
            pPVar3->dis = dVar8;
            pPVar3->id = iVar4;
          }
        }
      }
      pMVar16 = pMVar16 + 1;
    } while (pMVar16 !=
             (this->_mems_mirrors).super__Vector_base<Mirror,_std::allocator<Mirror>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  return;
}

Assistant:

void Mems::find_samples_next_to_mirror_fast(Portioner buckets){
        int       minfittingsamples = 999999;           //DeBUG
        int       x_y_distance;
  const int       x_y_distance_max = 20;                //maximum Distance between Mirror and Sample for x and y
        int       not_matching_mirror_ammount = 0;      //DebUG needed?

        bool      enough_samples;                       // needed?
        int       mirrornumber = 0;                     //ID

  const int       max_samples = 5;                      //max Ammount of needed Samples
  const int       min_samples = 2;


  //iterate selected_mirror all buckets
  for(auto selected_mirror = std::begin(_mems_mirrors); selected_mirror!=std::end(_mems_mirrors); ++selected_mirror){
    mirrornumber += 1;
    x_y_distance = 5;
    enough_samples = false;
    //fill vec with all relevant samplepoints with samples from mirrorbucket and buckets arround
    std::vector<std::vector<Point_d>>point_cluster = buckets.get_bucket_cluster(selected_mirror->_position);
  //  std::cout<<"id: "<<selected_mirror->id<<"\n";
  //  std::cout<<"size: \n";
/*
    int point_amm_in_cluster = 0;
    for(auto it = std::begin(point_cluster); it != std::end(point_cluster); it++){
      point_amm_in_cluster = point_amm_in_cluster+it->size();
    }

    std::cout<<"looking for samples for mirror "<< mirrornumber<<" with "<<point_amm_in_cluster<<" Points in MirrorCluster"<<"\n";
*/
    while(x_y_distance<x_y_distance_max ){
      //  while(x_y_distance<x_y_distance_max || (selected_mirror->_matching_samples.size() < min_samples)){
          selected_mirror->_matching_samples.clear();
          selected_mirror->_ammount_of_matching_samples = 0;
          //      std::cout<<" x_y_distance = "<<x_y_distance<<"\n";
          for(auto cluster_part = std::begin(point_cluster); cluster_part!=std::end(point_cluster); ++cluster_part)
          {
            for(auto point_to_check = std::begin(*cluster_part); point_to_check != std::end(*cluster_part); ++point_to_check)
            {
              //perform this actions for all Samples which are in bucket for mirror


              //----> nicht nötig          //check, if ammount of needed samples is reached
              //----> nicht nötig          //not reached: suche mit der aktuellen sample_distance in den buckets nach reached samples
                                  //  wenn distance <= (maxdis^2)*2
                                  //  put distance to point struct
                                  //  push back point to selected mirror
                                  //  incremet ammountof matching samples im selected mirror
                                  //  if ammount of matching samples = max_sample
                                  // break, go to next mems_mirror

              double sample_dis = pow(selected_mirror->_position.x-point_to_check->x , 2)+pow(selected_mirror->_position.y-point_to_check->y , 2);
              if(sample_dis<=x_y_distance*x_y_distance*2)
              {
                point_to_check->dis = sample_dis;
                selected_mirror->_matching_samples.push_back(*point_to_check);
                selected_mirror->_ammount_of_matching_samples = selected_mirror->_ammount_of_matching_samples +1;
  //              std::cout<<selected_mirror->_matching_samples.size()<<" ";

                //std::cout << "break2 \n" ;
              //  break;

              }
          //  MAXSAMPLES:
            }
          }
            if(selected_mirror->_matching_samples.size() >= max_samples){
            //  goto MAXSAMPLES;
            //    std::cout << "break1 \n" ;
            break;
            }
            x_y_distance += 2;
          }

          if(selected_mirror->id % 10000 == 0)
          {
            int progress = (int)((double)selected_mirror->id/(double)_mems_mirrors.size()*100) ;
            std::cout <<"Find samples for all Mems-Mirrors  "<< progress <<" % . \n";
          }

          if(minfittingsamples > selected_mirror->_matching_samples.size())
          {
            minfittingsamples = selected_mirror->_matching_samples.size();
            //std::cout << "Minimal fitting samples sind jetzt " <<minfittingsamples<<"\n \n";
          }
          if(minfittingsamples == 0 && selected_mirror->_matching_samples.size()==0)
          {
            not_matching_mirror_ammount += 1;
          }
        }
      //      std::cout << "not matching mirrorammount =  " <<not_matching_mirror_ammount<<"\n";
      std::cout << "All samples for Mirrors found"<< '\n';

      for(auto mirror = std::begin(_mems_mirrors); mirror != std::end(_mems_mirrors); ++mirror)
      {
        std::sort(mirror->_matching_samples.begin(), mirror->_matching_samples.end(), compare_by_distance);
      }

  }